

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O0

Mesh * vera::planeMesh(Mesh *__return_storage_ptr__,float _width,float _height,int _columns,
                      int _rows,DrawMode _drawMode)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int local_78;
  int local_74;
  int x_2;
  int y_1;
  int x_1;
  int x;
  int y;
  int ix;
  int iy;
  float halfH;
  float halfW;
  vec2 texcoord;
  vec3 normal;
  vec3 vert;
  DrawMode local_24;
  DrawMode _drawMode_local;
  int _rows_local;
  int _columns_local;
  float _height_local;
  float _width_local;
  Mesh *mesh;
  
  Mesh::Mesh(__return_storage_ptr__);
  local_24 = _drawMode;
  if ((_drawMode != TRIANGLE_STRIP) && (_drawMode != TRIANGLES)) {
    local_24 = TRIANGLES;
  }
  iVar1 = _columns + 1;
  iVar2 = _rows + 1;
  Mesh::setDrawMode(__return_storage_ptr__,local_24);
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            ((vec<3,_float,_(glm::qualifier)0> *)&normal.field_1,0.0,0.0,0.0);
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            ((vec<3,_float,_(glm::qualifier)0> *)&texcoord,0.0,0.0,1.0);
  glm::vec<2,_float,_(glm::qualifier)0>::vec((vec<2,_float,_(glm::qualifier)0> *)&halfH,0.0,0.0);
  for (y = 0; y != iVar2; y = y + 1) {
    for (x = 0; x != iVar1; x = x + 1) {
      halfH = (float)x / ((float)iVar1 - 1.0);
      halfW = 1.0 - (float)y / ((float)iVar2 - 1.0);
      normal.field_1.y = halfH * _width - _width * 0.5;
      normal.field_2.z = -(halfW - 1.0) * _height - _height * 0.5;
      Mesh::addVertex(__return_storage_ptr__,(vec3 *)&normal.field_1);
      Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&halfH);
      Mesh::addNormal(__return_storage_ptr__,(vec3 *)&texcoord);
    }
  }
  if (local_24 == TRIANGLE_STRIP) {
    for (x_1 = 0; x_1 < _rows; x_1 = x_1 + 1) {
      x_2 = _columns;
      if ((x_1 & 1U) == 0) {
        for (y_1 = 0; y_1 < iVar1; y_1 = y_1 + 1) {
          Mesh::addIndex(__return_storage_ptr__,x_1 * iVar1 + y_1);
          Mesh::addIndex(__return_storage_ptr__,(x_1 + 1) * iVar1 + y_1);
        }
      }
      else {
        for (; 0 < x_2; x_2 = x_2 + -1) {
          Mesh::addIndex(__return_storage_ptr__,(x_1 + 1) * iVar1 + x_2);
          Mesh::addIndex(__return_storage_ptr__,x_1 * iVar1 + -1 + x_2);
        }
      }
    }
    if (iVar2 % 2 != 0) {
      sVar3 = Mesh::getVerticesTotal(__return_storage_ptr__);
      Mesh::addIndex(__return_storage_ptr__,(int)sVar3 - iVar1);
    }
  }
  else {
    for (local_74 = 0; local_74 < _rows; local_74 = local_74 + 1) {
      for (local_78 = 0; local_78 < _columns; local_78 = local_78 + 1) {
        Mesh::addIndex(__return_storage_ptr__,local_74 * iVar1 + local_78);
        Mesh::addIndex(__return_storage_ptr__,local_74 * iVar1 + 1 + local_78);
        Mesh::addIndex(__return_storage_ptr__,(local_74 + 1) * iVar1 + local_78);
        Mesh::addIndex(__return_storage_ptr__,local_74 * iVar1 + 1 + local_78);
        Mesh::addIndex(__return_storage_ptr__,(local_74 + 1) * iVar1 + 1 + local_78);
        Mesh::addIndex(__return_storage_ptr__,(local_74 + 1) * iVar1 + local_78);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mesh planeMesh(float _width, float _height, int _columns, int _rows, DrawMode _drawMode) {
    Mesh mesh;

    if (_drawMode != TRIANGLE_STRIP && _drawMode != TRIANGLES)
        _drawMode = TRIANGLES;

    _columns++;
    _rows++;

    mesh.setDrawMode(_drawMode);

    glm::vec3 vert(0.0f, 0.0f, 0.0f);
    glm::vec3 normal(0.0f, 0.0f, 1.0f); // always facing forward //
    glm::vec2 texcoord(0.0f, 0.0f);

    // the origin of the plane is at the center //
    float halfW = _width  * 0.5f;
    float halfH = _height * 0.5f;
    
    // add the vertexes //
    for (int iy = 0; iy != _rows; iy++) {
        for (int ix = 0; ix != _columns; ix++) {

            // normalized tex coords //
            texcoord.x =       ((float)ix/((float)_columns-1));
            texcoord.y = 1.f - ((float)iy/((float)_rows-1));

            vert.x = texcoord.x * _width - halfW;
            vert.y = -(texcoord.y-1) * _height - halfH;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    if (_drawMode == TRIANGLE_STRIP) {
        for (int y = 0; y < _rows-1; y++) {
            // even _rows //
            if ((y&1)==0) {
                for (int x = 0; x < _columns; x++) {
                    mesh.addIndex( (y) * _columns + x );
                    mesh.addIndex( (y+1) * _columns + x);
                }
            }
            else {
                for (int x = _columns-1; x >0; x--) {
                    mesh.addIndex( (y+1) * _columns + x );
                    mesh.addIndex( y * _columns + x-1 );
                }
            }
        }

        if (_rows%2 != 0) mesh.addIndex(mesh.getVerticesTotal() - _columns);
    }
    else {

        // Triangles //
        for (int y = 0; y < _rows - 1; y++) {
            for (int x = 0; x < _columns - 1; x++) {
                // first triangle //
                mesh.addIndex((y) *_columns + x);
                mesh.addIndex((y) *_columns + x + 1);
                mesh.addIndex((y + 1) *_columns + x);

                // second triangle //
                mesh.addIndex((y) * _columns + x+1);
                mesh.addIndex((y + 1) *_columns + x+1);
                mesh.addIndex((y + 1) *_columns + x);
            }
        }
    }

    return mesh;
}